

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O2

void __thiscall imrt::Collimator::insertXorder(Collimator *this,double x)

{
  vector<double,_std::allocator<double>_> *this_00;
  pointer pdVar1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var2;
  double *pdVar3;
  long lVar4;
  int j;
  ulong uVar5;
  bool bVar6;
  double local_38;
  
  this_00 = &this->xcoord;
  local_38 = x;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_equals_val<double_const>>
                    ((this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_38);
  pdVar3 = (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar6 = _Var2._M_current != pdVar3;
  lVar4 = 0;
  uVar5 = 0;
  while ((pdVar1 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start,
         uVar5 < (ulong)((long)pdVar3 - (long)pdVar1 >> 3) && (!bVar6))) {
    bVar6 = local_38 < *(double *)((long)pdVar1 + lVar4);
    if (local_38 < *(double *)((long)pdVar1 + lVar4)) {
      std::vector<double,_std::allocator<double>_>::insert
                (this_00,(double *)((long)pdVar1 + lVar4),&local_38);
      pdVar3 = (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 8;
  }
  if (!bVar6) {
    std::vector<double,_std::allocator<double>_>::push_back(this_00,&local_38);
  }
  return;
}

Assistant:

void Collimator::insertXorder(double x) {
    bool flag=false;
    if (find(xcoord.begin(), xcoord.end(), x) != xcoord.end())
      flag=true;
    for (int j=0; j< xcoord.size() && !flag; j++) {
      if (xcoord[j] > x) {
        xcoord.insert(xcoord.begin()+j, x);
        flag=true;
      }
    }
    if (!flag) xcoord.push_back(x);
  }